

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O0

bool duckdb::TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>
               (date_t input,timestamp_t *result,bool strict)

{
  dtime_t time;
  bool bVar1;
  timestamp_t tVar2;
  dtime_t result_00;
  byte in_DL;
  int64_t *in_RSI;
  int32_t in_EDI;
  undefined8 in_stack_ffffffffffffffc0;
  int32_t in_stack_ffffffffffffffc8;
  date_t in_stack_ffffffffffffffd0;
  date_t local_24 [3];
  date_t local_18;
  byte local_11;
  int64_t *local_10;
  date_t local_8;
  bool local_1;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  local_8.days = in_EDI;
  local_18 = date_t::infinity();
  bVar1 = date_t::operator==(&local_8,&local_18);
  if (bVar1) {
    tVar2 = timestamp_t::infinity();
    *local_10 = tVar2.value;
    local_1 = true;
  }
  else {
    local_24[0] = date_t::ninfinity();
    bVar1 = date_t::operator==(&local_8,local_24);
    if (bVar1) {
      tVar2 = timestamp_t::ninfinity();
      *local_10 = tVar2.value;
      local_1 = true;
    }
    else {
      result_00 = Time::FromTime(local_8.days,in_stack_ffffffffffffffc8,
                                 (int32_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                                 (int32_t)in_stack_ffffffffffffffc0);
      time.micros._4_4_ = local_8.days;
      time.micros._0_4_ = in_stack_ffffffffffffffc8;
      local_1 = Timestamp::TryFromDatetime
                          (in_stack_ffffffffffffffd0,time,(timestamp_t *)result_00.micros);
    }
  }
  return local_1;
}

Assistant:

bool TryCast::Operation(date_t input, timestamp_t &result, bool strict) {
	if (input == date_t::infinity()) {
		result = timestamp_t::infinity();
		return true;
	} else if (input == date_t::ninfinity()) {
		result = timestamp_t::ninfinity();
		return true;
	}
	return Timestamp::TryFromDatetime(input, Time::FromTime(0, 0, 0), result);
}